

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBailOnNotBuiltIn
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut)

{
  Instr *pIVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  _E _Var5;
  int iVar6;
  int32 n;
  Opnd *pOVar7;
  undefined4 *puVar8;
  ScriptContextInfo *pSVar9;
  undefined4 extraout_var;
  IntConstOpnd *this_00;
  MemRefOpnd *compareSrc2;
  LabelInstr *target;
  LabelInstr *continueLabel;
  Opnd *builtIn;
  long lStack_38;
  BuiltinFunction builtInIndex;
  intptr_t builtInFuncs;
  Instr *prevInstr;
  LabelInstr *labelBailOut_local;
  BranchInstr *branchInstr_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar7 = IR::Instr::GetSrc2(instr);
  bVar4 = IR::Opnd::IsIntConstOpnd(pOVar7);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3218,"(instr->GetSrc2()->IsIntConstOpnd())",
                       "instr->GetSrc2()->IsIntConstOpnd()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pIVar1 = instr->m_prev;
  pSVar9 = Func::GetScriptContextInfo(this->m_func);
  iVar6 = (*pSVar9->_vptr_ScriptContextInfo[0x1f])();
  lStack_38 = CONCAT44(extraout_var,iVar6);
  pOVar7 = IR::Instr::UnlinkSrc2(instr);
  this_00 = IR::Opnd::AsIntConstOpnd(pOVar7);
  n = IR::IntConstOpnd::AsInt32(this_00);
  Js::BuiltinFunction::BuiltinFunction((BuiltinFunction *)((long)&builtIn + 7),n);
  lVar3 = lStack_38;
  _Var5 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&builtIn + 7));
  compareSrc2 = IR::MemRefOpnd::New((void *)(lVar3 + (int)((uint)_Var5 << 3)),TyInt64,instr->m_func,
                                    AddrOpndKindDynamicMisc);
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  pOVar7 = IR::Instr::UnlinkSrc1(instr);
  InsertCompareBranch(this,pOVar7,&compareSrc2->super_Opnd,BrEq_A,target,instr,false);
  GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotBuiltIn(IR::Instr       *instr,
                               IR::BranchInstr *branchInstr  /* = nullptr */,
                               IR::LabelInstr  *labelBailOut /* = nullptr */)
{
    Assert(instr->GetSrc2()->IsIntConstOpnd());
    IR::Instr *prevInstr = instr->m_prev;

    intptr_t builtInFuncs = m_func->GetScriptContextInfo()->GetBuiltinFunctionsBaseAddr();
    Js::BuiltinFunction builtInIndex = instr->UnlinkSrc2()->AsIntConstOpnd()->AsInt32();

    IR::Opnd *builtIn = IR::MemRefOpnd::New((void*)(builtInFuncs + builtInIndex * MachPtr), TyMachReg, instr->m_func);

#if TESTBUILTINFORNULL
    IR::LabelInstr * continueAfterTestLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    InsertTestBranch(builtIn, builtIn, Js::OpCode::BrNeq_A, continueAfterTestLabel, instr);
    this->m_lowererMD.GenerateDebugBreak(instr);
    instr->InsertBefore(continueAfterTestLabel);
#endif

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    instr->InsertAfter(continueLabel);
    InsertCompareBranch(instr->UnlinkSrc1(), builtIn, Js::OpCode::BrEq_A, continueLabel, instr);

    GenerateBailOut(instr, branchInstr, labelBailOut);

    return prevInstr;
}